

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

void __thiscall dgPolyhedra::ChangeEdgeIncidentVertex(dgPolyhedra *this,dgEdge *edge,HaI32 newIndex)

{
  dgTreeNode *pdVar1;
  dgEdge *info;
  
  info = edge;
  do {
    pdVar1 = dgTree<dgEdge,_long>::GetNodeFromInfo(&this->super_dgTree<dgEdge,_long>,info);
    dgTree<dgEdge,_long>::ReplaceKey
              (&this->super_dgTree<dgEdge,_long>,pdVar1,
               (long)info->m_twin->m_incidentVertex | (long)newIndex << 0x20);
    pdVar1 = dgTree<dgEdge,_long>::GetNodeFromInfo(&this->super_dgTree<dgEdge,_long>,info->m_twin);
    dgTree<dgEdge,_long>::ReplaceKey
              (&this->super_dgTree<dgEdge,_long>,pdVar1,
               (ulong)(uint)info->m_twin->m_incidentVertex << 0x20 | (long)newIndex);
    info->m_incidentVertex = newIndex;
    info = info->m_twin->m_next;
  } while (info != edge);
  return;
}

Assistant:

void dgPolyhedra::ChangeEdgeIncidentVertex (dgEdge* const edge, hacd::HaI32 newIndex)
{
	dgEdge* ptr = edge;
	do {
		dgTreeNode* node = GetNodeFromInfo(*ptr);
		dgPairKey Key0 (newIndex, ptr->m_twin->m_incidentVertex);
		ReplaceKey (node, Key0.GetVal());

		node = GetNodeFromInfo(*ptr->m_twin);
		dgPairKey Key1 (ptr->m_twin->m_incidentVertex, newIndex);
		ReplaceKey (node, Key1.GetVal());

		ptr->m_incidentVertex = newIndex;

		ptr = ptr->m_twin->m_next;
	} while (ptr != edge);
}